

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v5::print<char[100],std::__cxx11::string,std::__cxx11::string>
          (v5 *this,FILE *f,string_view format_str,char (*args) [100],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  string_view format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_88;
  FILE *local_78;
  char *local_70;
  undefined1 local_68 [8];
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char[100],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  as;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [100];
  FILE *f_local;
  string_view format_str_local;
  
  as.data_[2].field_0.custom.format =
       (_func_void_void_ptr_basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_ptr
        *)args_1;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char[100],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char[100],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_68,(char (*) [100])format_str.size_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                     args_1);
  local_78 = f;
  local_70 = format_str.data_;
  format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[100],std::__cxx11::string,std::__cxx11::string>&>
            ((format_args *)&local_88,
             (format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char[100],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68);
  format_str_00.size_ = (size_t)local_70;
  format_str_00.data_ = (char *)local_78;
  vprint((FILE *)this,format_str_00,(format_args)local_88);
  return;
}

Assistant:

inline void print(std::FILE *f, string_view format_str, const Args & ... args) {
  format_arg_store<format_context, Args...> as(args...);
  vprint(f, format_str, as);
}